

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

void duckdb_je_extent_destroy_wrapper(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata)

{
  int8_t *piVar1;
  ulong uVar2;
  extent_hooks_t *peVar3;
  tsd_t *ptVar4;
  void *addr;
  ulong size;
  long *in_FS_OFFSET;
  
  if ((edata->e_bits & 0x10000) != 0) {
    duckdb_je_san_unguard_pages_pre_destroy(tsdn,ehooks,edata,pac->emap);
  }
  addr = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  edata->e_addr = addr;
  size = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  uVar2 = edata->e_bits;
  peVar3 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar3 == &duckdb_je_ehooks_default_extent_hooks) {
    duckdb_je_ehooks_default_destroy_impl(addr,size);
  }
  else if (peVar3->destroy != (extent_destroy_t *)0x0) {
    ptVar4 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar4 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
      ptVar4 = duckdb_je_tsd_fetch_slow(ptVar4,false);
    }
    ptVar4->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar4->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar4->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar4);
    }
    (*peVar3->destroy)(peVar3,addr,size,(_Bool)((byte)(uVar2 >> 0xd) & 1),ehooks->ind);
    ptVar4 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar4 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
      ptVar4 = duckdb_je_tsd_fetch_slow(ptVar4,false);
    }
    piVar1 = &ptVar4->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == '\0') {
      duckdb_je_tsd_slow_update(ptVar4);
    }
  }
  duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
  return;
}

Assistant:

void
extent_destroy_wrapper(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata) {
	assert(edata_base_get(edata) != NULL);
	assert(edata_size_get(edata) != 0);
	extent_state_t state = edata_state_get(edata);
	assert(state == extent_state_retained || state == extent_state_active);
	assert(emap_edata_is_acquired(tsdn, pac->emap, edata));
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	if (edata_guarded_get(edata)) {
		assert(opt_retain);
		san_unguard_pages_pre_destroy(tsdn, ehooks, edata, pac->emap);
	}
	edata_addr_set(edata, edata_base_get(edata));

	/* Try to destroy; silently fail otherwise. */
	ehooks_destroy(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), edata_committed_get(edata));

	edata_cache_put(tsdn, pac->edata_cache, edata);
}